

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guardedTests.cpp
# Opt level: O2

void __thiscall
shared_guarded_shared_guarded_2_Test::~shared_guarded_shared_guarded_2_Test
          (shared_guarded_shared_guarded_2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(shared_guarded, shared_guarded_2)
{
    shared_guarded<int, shared_mutex> data(0);

    std::thread th1([&data]() {
        for (int i = 0; i < 100000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    std::thread th2([&data]() {
        for (int i = 0; i < 100000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    std::thread th3([&data]() {
        int last_val = 0;
        while (last_val != 200000) {
            auto data_handle = data.lock_shared();
            EXPECT_TRUE(last_val <= *data_handle);
            last_val = *data_handle;
        }
    });

    th1.join();
    th2.join();
    th3.join();

    auto data_handle = data.lock();

    EXPECT_EQ(*data_handle, 200000);
}